

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknetactivation.cpp
# Opt level: O0

int ncnn::activate_op_inplace<ncnn::activate_op_relie<float>>(Mat *a,Option *opt)

{
  float *x;
  long in_RDI;
  int i;
  Mat cmat;
  int c;
  int size;
  int channels;
  activate_op_relie<float> op;
  float *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  int local_64;
  Mat local_60;
  int local_20;
  int local_1c;
  int local_18;
  activate_op_relie<float> local_11 [17];
  
  local_18 = *(int *)(in_RDI + 0x34);
  local_1c = *(int *)(in_RDI + 0x2c) * *(int *)(in_RDI + 0x30);
  for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    for (local_64 = 0; local_64 < local_1c; local_64 = local_64 + 1) {
      x = Mat::operator[](&local_60,(long)local_64);
      in_stack_ffffffffffffff7c = activate_op_relie<float>::operator()(local_11,x);
      in_stack_ffffffffffffff70 = Mat::operator[](&local_60,(long)local_64);
      *in_stack_ffffffffffffff70 = in_stack_ffffffffffffff7c;
    }
    Mat::~Mat((Mat *)0x1b47ab);
  }
  return 0;
}

Assistant:

static int activate_op_inplace(Mat &a, const Option &opt)
{
  Op op;
  int channels = a.c;
  int size = a.w * a.h;

  #pragma omp parallel for num_threads(opt.num_threads)
  for (int c = 0; c < channels; c++)
  {
    Mat cmat = a.channel(c);
    for (int i = 0; i < size; i++)
      cmat[i] = op(cmat[i]);
  }
  return 0;
}